

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_set_complexity(REF_DBL *metric,REF_GRID ref_grid,REF_DBL target_complexity)

{
  int iVar1;
  REF_NODE pRVar2;
  uint uVar3;
  long lVar4;
  REF_DBL *pRVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  REF_DBL RVar10;
  REF_DBL current_complexity;
  double local_70;
  REF_GRID local_68;
  double local_60;
  REF_DBL local_58;
  REF_DBL local_48;
  REF_DBL RStack_40;
  
  pRVar2 = ref_grid->node;
  iVar1 = ref_grid->twod;
  local_58 = target_complexity;
  uVar3 = ref_metric_complexity(metric,ref_grid,&local_70);
  if (uVar3 == 0) {
    auVar8._0_8_ = local_70 * 1e+20;
    auVar8._8_8_ = local_58;
    auVar9._8_8_ = -local_58;
    auVar9._0_8_ = -auVar8._0_8_;
    auVar9 = maxpd(auVar8,auVar9);
    uVar3 = 4;
    if (auVar9._8_8_ < auVar9._0_8_) {
      if (0 < pRVar2->max) {
        dVar7 = *(double *)(&DAT_00210600 + (ulong)(iVar1 == 0) * 8);
        lVar4 = 0;
        local_48 = 0.0;
        RStack_40 = 1.0;
        pRVar5 = metric;
        RVar10 = local_58;
        local_68 = ref_grid;
        local_60 = dVar7;
        do {
          if (-1 < pRVar2->global[lVar4]) {
            lVar6 = 0;
            do {
              dVar7 = pow(RVar10 / local_70,dVar7);
              pRVar5[lVar6] = dVar7 * pRVar5[lVar6];
              lVar6 = lVar6 + 1;
              dVar7 = local_60;
              RVar10 = local_58;
            } while (lVar6 != 6);
            if (local_68->twod != 0) {
              metric[lVar4 * 6 + 2] = 0.0;
              metric[lVar4 * 6 + 4] = local_48;
              (metric + lVar4 * 6 + 4)[1] = RStack_40;
            }
          }
          lVar4 = lVar4 + 1;
          pRVar5 = pRVar5 + 6;
        } while (lVar4 < pRVar2->max);
      }
      uVar3 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x7c8,
           "ref_metric_set_complexity",(ulong)uVar3,"cmp");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_metric_set_complexity(REF_DBL *metric, REF_GRID ref_grid,
                                             REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_DBL current_complexity;
  REF_DBL complexity_scale;

  complexity_scale = 2.0 / 3.0;
  if (ref_grid_twod(ref_grid)) {
    complexity_scale = 1.0;
  }

  RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (!ref_math_divisible(target_complexity, current_complexity)) {
    return REF_DIV_ZERO;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(target_complexity / current_complexity, complexity_scale);
    }
    if (ref_grid_twod(ref_grid)) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  return REF_SUCCESS;
}